

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  __errfunc *in_RCX;
  int __flags;
  int __flags_00;
  ulong uVar7;
  string *__pattern;
  glob_t *in_R8;
  allocator local_61;
  glob glob;
  string local_50;
  
  if (argc < 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    __s = *argv;
    sVar4 = strlen(__s);
    pcVar5 = __s + sVar4;
    do {
      pcVar6 = pcVar5;
      pcVar5 = pcVar6 + -1;
      if ((pcVar5 <= __s) || (*pcVar5 == '\\')) break;
    } while (*pcVar5 != '/');
    poVar3 = std::operator<<(poVar3,pcVar6);
    poVar3 = std::operator<<(poVar3,' ');
    poVar3 = std::operator<<(poVar3,"pattern1 [pattern2 [...]]");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar2 = 1;
  }
  else {
    for (uVar7 = 1; uVar7 != (uint)argc; uVar7 = uVar7 + 1) {
      std::__cxx11::string::string((string *)&local_50,argv[uVar7],&local_61);
      ::glob::glob::glob(&glob,(char *)&local_50,__flags,in_RCX,in_R8);
      std::__cxx11::string::~string((string *)&local_50);
      __pattern = (string *)0x1;
      ::glob::glob::use_full_paths(&glob,true);
      while( true ) {
        bVar1 = ::glob::glob::is_valid(&glob);
        if (!bVar1) break;
        ::glob::glob::current_match_abi_cxx11_(&local_50,&glob);
        __pattern = &local_50;
        poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&local_50);
        ::glob::glob::next(&glob);
      }
      ::glob::glob::~glob(&glob,(char *)__pattern,__flags_00,in_RCX,in_R8);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char **argv) {
    if (argc < 2) {
        std::cerr
            << "Usage: " << get_base_name(argv[0]) << ' '
            << "pattern1 [pattern2 [...]]"
            << std::endl;
        return 1;
    }
    for (int i = 1; i < argc; i++) {
        glob::glob glob(argv[i]);
        glob.use_full_paths(true);
        while (glob) {
            std::cout << glob.current_match() << std::endl;
            glob.next();
        }
    }
    return 0;
}